

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::SetPermissions(string *file,mode_t mode,bool honor_umask)

{
  bool bVar1;
  __mode_t __mask;
  int iVar2;
  
  bVar1 = PathExists(file);
  if (bVar1) {
    if (honor_umask) {
      __mask = umask(0);
      umask(__mask);
      mode = mode & ~__mask;
    }
    iVar2 = chmod((file->_M_dataplus)._M_p,mode);
    bVar1 = -1 < iVar2;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SystemTools::SetPermissions(const std::string& file, mode_t mode,
                                 bool honor_umask)
{
  if (!SystemTools::PathExists(file)) {
    return false;
  }
  if (honor_umask) {
    mode_t currentMask = umask(0);
    umask(currentMask);
    mode &= ~currentMask;
  }
#ifdef _WIN32
  if (_wchmod(Encoding::ToWindowsExtendedPath(file).c_str(), mode) < 0)
#else
  if (chmod(file.c_str(), mode) < 0)
#endif
  {
    return false;
  }

  return true;
}